

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O1

domain_manager * __thiscall
cs::domain_manager::add_var_global<char_const(&)[11]>
          (domain_manager *this,char (*name) [11],var *var)

{
  domain_type *pdVar1;
  size_t sVar2;
  size_t sVar3;
  runtime_error *this_00;
  long *plVar4;
  error *peVar5;
  size_type *psVar6;
  string local_90;
  key_arg<std::__cxx11::basic_string<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  sVar2 = strlen(*name);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,name,*name + sVar2);
  pdVar1 = (this->m_data).m_start;
  if ((this->m_data).m_current == pdVar1) {
    peVar5 = (error *)__cxa_allocate_exception(0x28);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90.field_2._M_allocated_capacity._0_6_ = 0x4830303045;
    local_90._M_string_length = 5;
    cov::error::error(peVar5,&local_90);
    __cxa_throw(peVar5,&cov::error::typeinfo,cov::error::~error);
  }
  sVar3 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
          ::count<std::__cxx11::string>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                      *)pdVar1,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 == 0) {
    pdVar1 = (this->m_data).m_start;
    if ((this->m_data).m_current != pdVar1) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      sVar2 = strlen(*name);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,name,*name + sVar2);
      domain_type::add_var(pdVar1,&local_90,var);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      return this;
    }
    peVar5 = (error *)__cxa_allocate_exception(0x28);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90.field_2._M_allocated_capacity._0_6_ = 0x4830303045;
    local_90._M_string_length = 5;
    cov::error::error(peVar5,&local_90);
    __cxa_throw(peVar5,&cov::error::typeinfo,cov::error::~error);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  sVar2 = strlen(*name);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,name,*name + sVar2);
  std::operator+(&local_70,"Target domain exist variable \"",&local_50);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_90._M_dataplus._M_p = (pointer)*plVar4;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_90._M_dataplus._M_p == psVar6) {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90.field_2._8_8_ = plVar4[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar6;
  }
  local_90._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  runtime_error::runtime_error(this_00,&local_90);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

domain_manager &add_var_global(T &&name, const var &var)
		{
			if (var_exist_global(name))
				throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			else
				m_data.bottom().add_var(name, var);
			return *this;
		}